

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtpConsole.cpp
# Opt level: O3

char * __thiscall gnl::FtpConsole::getCommand(FtpConsole *this,char *buf,char *command)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = buf + -1;
  do {
    pcVar4 = pcVar5;
    bVar1 = pcVar4[1];
    pcVar5 = pcVar4 + 1;
  } while (bVar1 == 0x20);
  uVar3 = 0;
  while ((0x20 < bVar1 || ((0x100002401U >> ((ulong)bVar1 & 0x3f) & 1) == 0))) {
    command[uVar3] = bVar1;
    bVar1 = pcVar4[uVar3 + 2];
    uVar3 = uVar3 + 1;
  }
  command[uVar3 & 0xffffffff] = '\0';
  pcVar5 = pcVar4 + 1 + uVar3;
  do {
    pcVar4 = pcVar5;
    cVar2 = *pcVar4;
    pcVar5 = pcVar4 + 1;
  } while (cVar2 == ' ');
  while ((cVar2 != '\n' && (cVar2 != '\r'))) {
    cVar2 = *pcVar5;
    pcVar5 = pcVar5 + 1;
  }
  pcVar5[-1] = '\0';
  return pcVar4;
}

Assistant:

char* FtpConsole::getCommand(char* buf, char* command){
        while(*buf == ' '){
            ++buf;
        }
        int i = 0,j = 0;
        while(*buf != ' ' && *buf != '\r' && *buf != '\n' && *buf != '\0'){
            command[i] = *buf++;
            ++i;
        }
        command[i] = '\0';
        while(*buf == ' '){
            ++buf;
        }
        char* data = buf;
        i = 0;
        while(buf[i] != '\r' && buf[i] != '\n'){
            ++i;
        }
        buf[i] = '\0';
        return data;
    }